

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
bf_crc::convert_uint8_to_bitset(uint8_t *array,size_t size)

{
  ulong in_RDX;
  long in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  reference rVar1;
  int j;
  uint i;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *retVal;
  undefined1 in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff80;
  char cVar2;
  allocator<unsigned_long> *in_stack_ffffffffffffff88;
  block_type *in_stack_ffffffffffffff90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined4 local_34;
  undefined4 local_30;
  
  this = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1ec368);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (this,(size_type)in_RDI,(unsigned_long)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1ec38c);
  rVar1.m_mask = (block_type)in_stack_ffffffffffffff88;
  rVar1.m_block = in_stack_ffffffffffffff90;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    local_34 = 0;
    while( true ) {
      if (7 < local_34) break;
      cVar2 = -((*(byte *)(in_RSI + (ulong)local_30) >> ((byte)(7 - (char)local_34) & 0x1f) & 1) !=
               0);
      rVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         rVar1.m_block,rVar1.m_mask);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
                ((reference *)CONCAT17(cVar2,in_stack_ffffffffffffff80),
                 (bool)in_stack_ffffffffffffff7f);
      local_34 = local_34 + 1;
    }
  }
  return in_RDI;
}

Assistant:

boost::dynamic_bitset<> bf_crc::convert_uint8_to_bitset(const uint8_t array[], size_t size) {

	boost::dynamic_bitset<> retVal(size*8);

	for (unsigned int i = 0; i < size; i++)
		for (int j = 0; j < 8; j++)
			retVal[i*8+j] = (array[i] >> (7-j)) & 0x1 ? true : false;

	return retVal;
}